

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCase::ShaderRenderCase
          (ShaderRenderCase *this,TestContext *testCtx,string *name,string *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,UniformSetup *uniformSetup,
          AttributeSetupFunc attribFunc)

{
  ShaderEvaluator *pSVar1;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,testCtx,(name->_M_dataplus)._M_p,(description->_M_dataplus)._M_p);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderRenderCase_00cf8510;
  (this->m_vertShaderSource)._M_dataplus._M_p = (pointer)&(this->m_vertShaderSource).field_2;
  (this->m_vertShaderSource)._M_string_length = 0;
  (this->m_vertShaderSource).field_2._M_local_buf[0] = '\0';
  (this->m_fragShaderSource)._M_dataplus._M_p = (pointer)&(this->m_fragShaderSource).field_2;
  (this->m_fragShaderSource)._M_string_length = 0;
  (this->m_fragShaderSource).field_2._M_local_buf[0] = '\0';
  this->m_isVertexCase = isVertexCase;
  pSVar1 = (ShaderEvaluator *)operator_new(0x10);
  pSVar1->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00cf84c0;
  pSVar1->m_evalFunc = evalFunc;
  (this->m_evaluator).
  super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
  .m_data.ptr = pSVar1;
  if (uniformSetup == (UniformSetup *)0x0) {
    uniformSetup = (UniformSetup *)operator_new(0x10);
    uniformSetup->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00cf84e8;
    uniformSetup->m_setupFunc = (UniformSetupFunc)0x0;
  }
  (this->m_uniformSetup).
  super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>.
  m_data.ptr = uniformSetup;
  this->m_attribFunc = attribFunc;
  return;
}

Assistant:

ShaderRenderCase::ShaderRenderCase (tcu::TestContext&			testCtx,
									const std::string&			name,
									const std::string&			description,
									const bool					isVertexCase,
									const ShaderEvalFunc		evalFunc,
									const UniformSetup*			uniformSetup,
									const AttributeSetupFunc	attribFunc)
	: vkt::TestCase		(testCtx, name, description)
	, m_isVertexCase	(isVertexCase)
	, m_evaluator		(new ShaderEvaluator(evalFunc))
	, m_uniformSetup	(uniformSetup ? uniformSetup : new UniformSetup())
	, m_attribFunc		(attribFunc)
{}